

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# criticalsection.cc
# Opt level: O3

void __thiscall rtc::TryCritScope::~TryCritScope(TryCritScope *this)

{
  ostream *poVar1;
  FatalMessage local_180;
  
  if (this->lock_was_called_ != false) {
    if (this->locked_ == true) {
      CriticalSection::Leave(this->cs_);
    }
    return;
  }
  FatalMessage::FatalMessage
            (&local_180,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/base/criticalsection.cc"
             ,0xcc);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_180,"Check failed: lock_was_called_",0x1e);
  std::ios::widen((char)(ostream *)&local_180 + (char)*(undefined8 *)(local_180._0_8_ + -0x18));
  std::ostream::put((char)&local_180);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"# ",2);
  FatalMessage::~FatalMessage(&local_180);
}

Assistant:

TryCritScope::~TryCritScope() {
  CS_DEBUG_CODE(RTC_DCHECK(lock_was_called_));
  if (locked_)
    cs_->Leave();
}